

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O2

void transform_3(byte *data)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = *data;
  bVar2 = data[0x18];
  *(undefined8 *)(data + 0x10) = *(undefined8 *)(data + 0x12);
  *(undefined2 *)(data + 0x1c) = *(undefined2 *)(data + 0x1e);
  *(undefined8 *)data = *(undefined8 *)(data + 2);
  *(undefined8 *)(data + 8) = *(undefined8 *)(data + 10);
  *(undefined4 *)(data + 0x18) = *(undefined4 *)(data + 0x1a);
  data[0x1e] = data[0x1e] ^ data[2] ^ bVar1 ^ data[4] ^ data[6] ^ bVar2;
  data[0x1f] = data[3] ^ data[1] ^ data[5] ^ data[7] ^ data[0x19] ^ data[0x1f];
  return;
}

Assistant:

static void transform_3(byte * data)
{
    unsigned short int acc;
    acc = (data[0] ^ data[2] ^ data[4] ^ data[6] ^ data[24] ^ data[30]) |
        ((data[1] ^ data[3] ^ data[5] ^ data[7] ^ data[25] ^ data[31]) << 8);
    memmove(data, data + 2, 30);
    data[30] = acc & 0xff;
    data[31] = acc >> 8;
}